

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

double TasGrid::RuleLocal::scaleX<(TasGrid::RuleLocal::erule)1>(int point,double x)

{
  int iVar1;
  double x_local;
  double dStack_10;
  int point_local;
  
  dStack_10 = x;
  if (point != 0) {
    if (point == 1) {
      dStack_10 = x + 1.0;
    }
    else if (point == 2) {
      dStack_10 = x - 1.0;
    }
    else {
      iVar1 = Maths::int2log2(point + -1);
      dStack_10 = ((double)iVar1 * (x + 3.0) + 1.0) - (double)(point << 1);
    }
  }
  return dStack_10;
}

Assistant:

double scaleX(int point, double x) {
        switch(effective_rule) {
            case erule::pwc:
                return 0.0; // should never be called
            case erule::localp:
                switch(point) {
                    case 0: return x;
                    case 1: return (x + 1.0);
                    case 2: return (x - 1.0);
                    default:
                        return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
                };
            case erule::semilocalp:
                return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
            case erule::localp0:
                return ((double) Maths::int2log2(point + 1) * (x + 3.0) - 3.0 - (double) (2*point));
            default: // case erule::localpb:
                switch(point) {
                    case 0: return (x + 1.0) / 2.0;
                    case 1: return (x - 1.0) / 2.0;
                    case 2: return x;
                    default:
                        return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
                };
        };
    }